

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Iterator * __thiscall
kj::
MappedIterable<kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<kj::String,_int>::Entry>_>
::end(Iterator *__return_storage_ptr__,
     MappedIterable<kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<kj::String,_int>::Entry>_>
     *this)

{
  _::BTreeImpl::end(&__return_storage_ptr__->inner,(BTreeImpl *)&this->inner->erasedCount);
  (__return_storage_ptr__->super_TableMapping<kj::TreeMap<kj::String,_int>::Entry>).table =
       (this->super_TableMapping<kj::TreeMap<kj::String,_int>::Entry>).table;
  return __return_storage_ptr__;
}

Assistant:

inline Iterator end() { return { inner.end(), (Mapping&)*this }; }